

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O1

void __thiscall cmOrderDirectories::FindConflicts(cmOrderDirectories *this)

{
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar1;
  pointer ppVar2;
  pointer ppVar3;
  long lVar4;
  pointer puVar5;
  ulong uVar6;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __first;
  ConflictList *cl;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  value_type_conflict2 local_2c;
  
  std::vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>::
  resize(&this->ConflictGraph,
         (long)(this->OriginalDirectories).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->OriginalDirectories).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_2c = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->DirectoryVisited,
             (long)(this->OriginalDirectories).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->OriginalDirectories).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,&local_2c);
  puVar5 = (this->ConstraintEntries).
           super__Vector_base<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->ConstraintEntries).
      super__Vector_base<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar5) {
    uVar6 = 0;
    do {
      cmOrderDirectoriesConstraint::FindConflicts
                (puVar5[uVar6]._M_t.
                 super___uniq_ptr_impl<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmOrderDirectoriesConstraint_*,_std::default_delete<cmOrderDirectoriesConstraint>_>
                 .super__Head_base<0UL,_cmOrderDirectoriesConstraint_*,_false>._M_head_impl,
                 (uint)uVar6);
      uVar6 = (ulong)((uint)uVar6 + 1);
      puVar5 = (this->ConstraintEntries).
               super__Vector_base<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->ConstraintEntries).
                                   super__Vector_base<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>,_std::allocator<std::unique_ptr<cmOrderDirectoriesConstraint,_std::default_delete<cmOrderDirectoriesConstraint>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3));
  }
  pvVar1 = &((this->ConflictGraph).
             super__Vector_base<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>;
  for (this_00 = &((this->ConflictGraph).
                   super__Vector_base<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>;
      this_00 != pvVar1; this_00 = this_00 + 1) {
    ppVar2 = (this_00->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_start;
    ppVar3 = (this_00->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    if (ppVar2 != ppVar3) {
      uVar6 = (long)ppVar3 - (long)ppVar2 >> 3;
      lVar4 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (ppVar2,ppVar3,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (ppVar2,ppVar3);
    }
    __first = std::
              __unique<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmOrderDirectoriesCompare>>
                        ((this_00->
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (this_00->
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_erase
              (this_00,(iterator)__first._M_current,
               (this_00->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish);
  }
  FindImplicitConflicts(this);
  return;
}

Assistant:

void cmOrderDirectories::FindConflicts()
{
  // Allocate the conflict graph.
  this->ConflictGraph.resize(this->OriginalDirectories.size());
  this->DirectoryVisited.resize(this->OriginalDirectories.size(), 0);

  // Find directories conflicting with each entry.
  for (unsigned int i = 0; i < this->ConstraintEntries.size(); ++i) {
    this->ConstraintEntries[i]->FindConflicts(i);
  }

  // Clean up the conflict graph representation.
  for (ConflictList& cl : this->ConflictGraph) {
    // Sort the outgoing edges for each graph node so that the
    // original order will be preserved as much as possible.
    std::sort(cl.begin(), cl.end());

    // Make the edge list unique so cycle detection will be reliable.
    auto last = std::unique(cl.begin(), cl.end(), cmOrderDirectoriesCompare());
    cl.erase(last, cl.end());
  }

  // Check items in implicit link directories.
  this->FindImplicitConflicts();
}